

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccs_test.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_25890::FailingLogger::error(FailingLogger *this,string *msg)

{
  Message *pMVar1;
  AssertHelper local_38 [3];
  Message local_20;
  string *local_18;
  string *msg_local;
  FailingLogger *this_local;
  
  local_18 = msg;
  msg_local = (string *)this;
  testing::Message::Message(&local_20);
  pMVar1 = testing::Message::operator<<(&local_20,(char (*) [8])0x1fae20);
  pMVar1 = testing::Message::operator<<(pMVar1,local_18);
  testing::internal::AssertHelper::AssertHelper
            (local_38,kFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/ccs_test.cpp"
             ,0xff,"Failed");
  testing::internal::AssertHelper::operator=(local_38,pMVar1);
  testing::internal::AssertHelper::~AssertHelper(local_38);
  testing::Message::~Message(&local_20);
  return;
}

Assistant:

virtual void error(const std::string &msg) { FAIL() << "error: " << msg; }